

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall crsGA::Logger::~Logger(Logger *this)

{
  Logger *this_local;
  
  this->_vptr_Logger = (_func_int **)&PTR__Logger_00133ba0;
  std::thread::~thread(&this->_thread);
  ThreadSafeQueue<crsGA::Logger::LogMessage>::~ThreadSafeQueue(&this->_queue);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<crsGA::LogHandler>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<crsGA::LogHandler>_>_>_>
  ::~map(&this->_logHandlersMap);
  return;
}

Assistant:

Logger::~Logger()
{
}